

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1aacf::IDLTypeIdentifierVisitor::visit_
          (IDLTypeIdentifierVisitor *this,Array *type)

{
  int iVar1;
  Type *type_00;
  UnsupportedType *this_00;
  undefined1 auVar2 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined8 local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  element_t;
  
  Typelib::Indirect::getIndirection();
  iVar1 = Typelib::Type::getCategory();
  if (iVar1 != 1) {
    type_00 = (Type *)Typelib::Indirect::getIndirection();
    std::__cxx11::string::string((string *)&bStack_c8,"",(allocator *)&local_a8);
    getIDLBase(&element_t,this,type_00,&bStack_c8);
    std::__cxx11::string::~string((string *)&bStack_c8);
    std::__cxx11::string::_M_assign((string *)&this->m_namespace);
    std::__cxx11::string::_M_assign((string *)&this->m_front);
    auVar2 = Typelib::Array::getDimension();
    local_88 = auVar2._0_8_;
    boost::lexical_cast<std::__cxx11::string,unsigned_long>
              (&local_80,(boost *)&local_88,auVar2._8_8_);
    std::operator+(&local_a8,"[",&local_80);
    std::operator+(&bStack_c8,&local_a8,"]");
    std::__cxx11::string::operator=((string *)&this->m_back,(string *)&bStack_c8);
    std::__cxx11::string::~string((string *)&bStack_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_80);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&element_t);
    return true;
  }
  this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string
            ((string *)&element_t,"multi-dimensional arrays are not supported in IDL",
             (allocator *)&bStack_c8);
  Typelib::UnsupportedType::UnsupportedType(this_00,(Type *)type,&element_t.first);
  __cxa_throw(this_00,&Typelib::UnsupportedType::typeinfo,Typelib::UnsupportedType::~UnsupportedType
             );
}

Assistant:

bool IDLTypeIdentifierVisitor::visit_(Array const& type)
    {
        if (type.getIndirection().getCategory() == Type::Array)
            throw UnsupportedType(type, "multi-dimensional arrays are not supported in IDL");

        pair<string, string> element_t = getIDLBase(type.getIndirection());
        m_namespace = element_t.first;
        m_front = element_t.second;
        m_back = "[" + boost::lexical_cast<string>(type.getDimension()) + "]";
        return true;
    }